

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatted_exporters.cpp
# Opt level: O2

string * generate_json_single_tree
                   (string *__return_storage_ptr__,IsoForest *model_outputs,
                   ExtIsoForest *model_outputs_ext,TreesIndexer *indexer,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *numeric_colnames,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *categ_colnames,
                   vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *categ_levels,bool output_tree_num,bool index1,size_t tree_num)

{
  string json_str;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> terminal_node_mappings_holder;
  size_t *terminal_node_mappings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&json_str,"",(allocator<char> *)&local_50);
  if (interrupt_switch == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)json_str._M_dataplus._M_p == &json_str.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(json_str.field_2._M_allocated_capacity._1_7_,json_str.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = json_str.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = json_str._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(json_str.field_2._M_allocated_capacity._1_7_,json_str.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = json_str._M_string_length;
    json_str._M_string_length = 0;
    json_str.field_2._M_local_buf[0] = '\0';
    json_str._M_dataplus._M_p = (pointer)&json_str.field_2;
  }
  else {
    terminal_node_mappings = (size_t *)0x0;
    terminal_node_mappings_holder._M_t.
    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
         (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
    get_tree_mappings(&terminal_node_mappings,&terminal_node_mappings_holder,model_outputs,
                      model_outputs_ext,indexer,tree_num);
    if (model_outputs == (IsoForest *)0x0) {
      traverse_ext_json(&json_str,0,model_outputs_ext,
                        (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + tree_num,terminal_node_mappings,
                        numeric_colnames,categ_colnames,categ_levels,output_tree_num,index1,tree_num
                       );
    }
    else {
      traverse_isoforest_json
                (&json_str,0,model_outputs,
                 (model_outputs->trees).
                 super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + tree_num,terminal_node_mappings,
                 numeric_colnames,categ_colnames,categ_levels,output_tree_num,index1,tree_num);
    }
    if (interrupt_switch == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)json_str._M_dataplus._M_p == &json_str.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(json_str.field_2._M_allocated_capacity._1_7_,json_str.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = json_str.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = json_str._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(json_str.field_2._M_allocated_capacity._1_7_,json_str.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = json_str._M_string_length;
      json_str._M_string_length = 0;
      json_str.field_2._M_local_buf[0] = '\0';
      json_str._M_dataplus._M_p = (pointer)&json_str.field_2;
    }
    else {
      std::operator+(&local_50,"{",&json_str);
      std::operator+(__return_storage_ptr__,&local_50,"}");
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
              (&terminal_node_mappings_holder);
  }
  std::__cxx11::string::~string((string *)&json_str);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_json_single_tree(const IsoForest *model_outputs,
                                      const ExtIsoForest *model_outputs_ext,
                                      const TreesIndexer *indexer,
                                      const std::vector<std::string> &numeric_colnames,
                                      const std::vector<std::string> &categ_colnames,
                                      const std::vector<std::vector<std::string>> &categ_levels,
                                      bool output_tree_num, bool index1, size_t tree_num)
{
    std::string json_str("");
    if (interrupt_switch) return json_str;

    const size_t *restrict terminal_node_mappings = nullptr;
    std::unique_ptr<size_t[]> terminal_node_mappings_holder(nullptr);
    get_tree_mappings(
        terminal_node_mappings,
        terminal_node_mappings_holder,
        model_outputs,
        model_outputs_ext,
        indexer,
        tree_num
    );

    if (model_outputs)
    {
        traverse_isoforest_json(
            json_str, 0,
            *model_outputs, model_outputs->trees[tree_num],
            terminal_node_mappings,
            numeric_colnames,
            categ_colnames,
            categ_levels,
            output_tree_num, index1, tree_num
        );
    }

    else
    {
        traverse_ext_json(
            json_str, 0,
            *model_outputs_ext, model_outputs_ext->hplanes[tree_num],
            terminal_node_mappings,
            numeric_colnames,
            categ_colnames,
            categ_levels,
            output_tree_num, index1, tree_num
        );
    }

    if (interrupt_switch) return json_str;

    return
        "{" +
        json_str +
        "}";
}